

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_compress_usingCTable_generic
                 (void *dst,size_t dstSize,void *src,size_t srcSize,FSE_CTable *ct,uint fast)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ushort uVar19;
  ulong uVar20;
  ushort uVar21;
  ulong uVar22;
  void *pvVar23;
  ulong *puVar24;
  
  if ((srcSize < 3) || (dstSize < 9)) {
    return 0;
  }
  puVar8 = (ulong *)((long)dst + (dstSize - 8));
  uVar22 = (ulong)*(byte *)((long)src + (srcSize - 1));
  uVar2 = (ushort)*ct;
  lVar12 = 1;
  if (uVar2 != 0) {
    lVar12 = (long)(1 << ((char)uVar2 - 1U & 0x1f));
  }
  uVar15 = ct[lVar12 + uVar22 * 2 + 2] + 0x8000;
  uVar3 = *(ushort *)
           ((long)ct +
           (long)(int)ct[lVar12 + uVar22 * 2 + 1] * 2 +
           (ulong)((uVar15 & 0xffff0000) - ct[lVar12 + uVar22 * 2 + 2] >>
                  ((byte)(uVar15 >> 0x10) & 0x3f)) * 2 + 4);
  if ((srcSize & 1) == 0) {
    uVar22 = (ulong)*(byte *)((long)src + (srcSize - 2));
    lVar4 = srcSize - 2;
    uVar15 = ct[lVar12 + uVar22 * 2 + 2] + 0x8000;
    uVar19 = *(ushort *)
              ((long)ct +
              (long)(int)ct[lVar12 + uVar22 * 2 + 1] * 2 +
              (ulong)((uVar15 & 0xffff0000) - ct[lVar12 + uVar22 * 2 + 2] >>
                     ((byte)(uVar15 >> 0x10) & 0x3f)) * 2 + 4);
    uVar22 = 0;
    uVar5 = 0;
    puVar24 = (ulong *)dst;
    uVar21 = uVar3;
  }
  else {
    uVar22 = (ulong)*(byte *)((long)src + (srcSize - 2));
    uVar15 = ct[lVar12 + uVar22 * 2 + 2] + 0x8000;
    uVar20 = (ulong)*(byte *)((long)src + (srcSize - 3));
    uVar10 = (ulong)ct[lVar12 + uVar20 * 2 + 2] + (ulong)uVar3;
    if (0x1fffff < uVar10) goto LAB_00109ed7;
    uVar21 = *(ushort *)
              ((long)ct +
              (long)(int)ct[lVar12 + uVar22 * 2 + 1] * 2 +
              (ulong)((uVar15 & 0xffff0000) - ct[lVar12 + uVar22 * 2 + 2] >>
                     ((byte)(uVar15 >> 0x10) & 0x3f)) * 2 + 4);
    lVar4 = srcSize - 3;
    uVar15 = BIT_mask[uVar10 >> 0x10] & (uint)uVar3;
    uVar19 = *(ushort *)
              ((long)ct +
              (long)(int)ct[lVar12 + uVar20 * 2 + 1] * 2 +
              (ulong)(uVar3 >> ((byte)(uVar10 >> 0x10) & 0x3f)) * 2 + 4);
    if (fast == 0) {
      if (puVar8 < dst) goto LAB_00109f15;
      puVar24 = (ulong *)((long)dst + (uVar10 >> 0x13));
      if (puVar8 < puVar24) {
        puVar24 = puVar8;
      }
      *(ulong *)dst = (ulong)uVar15;
    }
    else {
      if (puVar8 < dst) goto LAB_00109ef6;
      *(ulong *)dst = (ulong)uVar15;
      puVar24 = (ulong *)((long)dst + (uVar10 >> 0x13));
    }
    uVar5 = (uint)(uVar10 >> 0x10) & 7;
    uVar22 = (ulong)(uVar15 >> ((byte)((int)(uVar10 >> 0x13) << 3) & 0x3f));
  }
  pvVar23 = (void *)((long)src + lVar4);
  uVar20 = (ulong)uVar21;
  uVar10 = (ulong)uVar19;
  if ((srcSize & 2) == 0) {
    uVar9 = ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -1) * 2 + 2] + uVar20;
    if (0x1fffff < uVar9) goto LAB_00109ed7;
    uVar15 = uVar5 + (int)(uVar9 >> 0x10);
    if (0x3f < uVar15) goto LAB_00109eb8;
    pbVar1 = (byte *)((long)pvVar23 + -2);
    uVar10 = ct[lVar12 + (ulong)*pbVar1 * 2 + 2] + uVar10;
    if (0x1fffff < uVar10) goto LAB_00109ed7;
    uVar13 = uVar15 + (int)(uVar10 >> 0x10);
    if (0x3f < uVar13) goto LAB_00109eb8;
    uVar20 = (ulong)*(ushort *)
                     ((long)ct +
                     (long)(int)ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -1) * 2 + 1] * 2 +
                     (ulong)(uVar21 >> ((byte)(uVar9 >> 0x10) & 0x3f)) * 2 + 4);
    pvVar23 = (void *)((long)pvVar23 + -2);
    uVar22 = (ulong)((uint)uVar21 & BIT_mask[uVar9 >> 0x10]) << (sbyte)uVar5 |
             (ulong)((uint)uVar19 & BIT_mask[uVar10 >> 0x10]) << ((byte)uVar15 & 0x3f) | uVar22;
    uVar10 = (ulong)*(ushort *)
                     ((long)ct +
                     (long)(int)ct[lVar12 + (ulong)*pbVar1 * 2 + 1] * 2 +
                     (ulong)(uVar19 >> ((byte)(uVar10 >> 0x10) & 0x3f)) * 2 + 4);
    if (fast == 0) {
      if (puVar8 < puVar24) goto LAB_00109f15;
      puVar11 = (ulong *)((ulong)(uVar13 >> 3) + (long)puVar24);
      if (puVar8 < puVar11) {
        puVar11 = puVar8;
      }
      *puVar24 = uVar22;
      puVar24 = puVar11;
    }
    else {
      if (puVar8 < puVar24) {
LAB_00109ef6:
        __assert_fail("bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5f7,"void BIT_flushBitsFast(BIT_CStream_t *)");
      }
      *puVar24 = uVar22;
      puVar24 = (ulong *)((long)puVar24 + (ulong)(uVar13 >> 3));
    }
    uVar5 = uVar13 & 7;
    uVar22 = uVar22 >> ((byte)uVar13 & 0x38);
  }
  while( true ) {
    uVar15 = (uint)uVar20;
    if (pvVar23 <= src) break;
    uVar9 = ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -1) * 2 + 2] + uVar20;
    if (0x1fffff < uVar9) goto LAB_00109ed7;
    uVar13 = uVar5 + (int)(uVar9 >> 0x10);
    if (0x3f < uVar13) goto LAB_00109eb8;
    uVar16 = ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -2) * 2 + 2] + uVar10;
    if (0x1fffff < uVar16) goto LAB_00109ed7;
    uVar6 = uVar13 + (int)(uVar16 >> 0x10);
    if (0x3f < uVar6) goto LAB_00109eb8;
    uVar3 = *(ushort *)
             ((long)ct +
             (long)(int)ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -1) * 2 + 1] * 2 +
             (uVar20 >> ((byte)(uVar9 >> 0x10) & 0x3f)) * 2 + 4);
    uVar17 = (ulong)ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -3) * 2 + 2] + (ulong)uVar3;
    if (0x1fffff < uVar17) goto LAB_00109ed7;
    uVar14 = uVar6 + (int)(uVar17 >> 0x10);
    if (0x3f < uVar14) goto LAB_00109eb8;
    uVar19 = *(ushort *)
              ((long)ct +
              (long)(int)ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -2) * 2 + 1] * 2 +
              (uVar10 >> ((byte)(uVar16 >> 0x10) & 0x3f)) * 2 + 4);
    uVar18 = (ulong)ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -4) * 2 + 2] + (ulong)uVar19;
    if (0x1fffff < uVar18) goto LAB_00109ed7;
    uVar7 = uVar14 + (int)(uVar18 >> 0x10);
    if (0x3f < uVar7) goto LAB_00109eb8;
    uVar20 = (ulong)*(ushort *)
                     ((long)ct +
                     (long)(int)ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -3) * 2 + 1] * 2 +
                     (ulong)(uVar3 >> ((byte)(uVar17 >> 0x10) & 0x3f)) * 2 + 4);
    uVar22 = (ulong)(BIT_mask[uVar9 >> 0x10] & uVar15) << (sbyte)uVar5 | uVar22 |
             (ulong)(BIT_mask[uVar16 >> 0x10] & (uint)uVar10) << ((byte)uVar13 & 0x3f) |
             (ulong)(BIT_mask[uVar17 >> 0x10] & (uint)uVar3) << ((byte)uVar6 & 0x3f) |
             (ulong)(BIT_mask[uVar18 >> 0x10] & (uint)uVar19) << ((byte)uVar14 & 0x3f);
    uVar10 = (ulong)*(ushort *)
                     ((long)ct +
                     (long)(int)ct[lVar12 + (ulong)*(byte *)((long)pvVar23 + -4) * 2 + 1] * 2 +
                     (ulong)(uVar19 >> ((byte)(uVar18 >> 0x10) & 0x3f)) * 2 + 4);
    if (fast == 0) {
      if (puVar8 < puVar24) goto LAB_00109f15;
      *puVar24 = uVar22;
      puVar24 = (ulong *)((long)puVar24 + (ulong)(uVar7 >> 3));
      if (puVar8 < puVar24) {
        puVar24 = puVar8;
      }
    }
    else {
      if (puVar8 < puVar24) goto LAB_00109ef6;
      *puVar24 = uVar22;
      puVar24 = (ulong *)((long)puVar24 + (ulong)(uVar7 >> 3));
    }
    pvVar23 = (void *)((long)pvVar23 + -4);
    uVar5 = uVar7 & 7;
    uVar22 = uVar22 >> ((byte)uVar7 & 0x38);
  }
  if (uVar2 < 0x20) {
    uVar13 = uVar5 + uVar2;
    if (uVar13 < 0x40) {
      if (puVar8 < puVar24) {
LAB_00109f15:
        __assert_fail("bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
      }
      uVar22 = (ulong)(uVar15 & BIT_mask[uVar2]) << (sbyte)uVar5 | uVar22;
      *puVar24 = uVar22;
      uVar15 = (uVar13 & 7) + (uint)uVar2;
      if (uVar15 < 0x40) {
        puVar24 = (ulong *)((long)puVar24 + (ulong)(uVar13 >> 3));
        if (puVar8 < puVar24) {
          puVar24 = puVar8;
        }
        uVar22 = (ulong)((uint)uVar10 & BIT_mask[uVar2]) << (sbyte)(uVar13 & 7) |
                 uVar22 >> ((byte)uVar13 & 0x38);
        *puVar24 = uVar22;
        uVar5 = (uVar15 & 7) + 1;
        puVar24 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar24);
        if (puVar8 < puVar24) {
          puVar24 = puVar8;
        }
        puVar11 = (ulong *)((ulong)(uVar5 >> 3) + (long)puVar24);
        if (puVar8 < puVar11) {
          puVar11 = puVar8;
        }
        *puVar24 = uVar22 >> ((byte)uVar15 & 0x38) | 1L << (uVar15 & 7);
        if (puVar8 <= puVar11) {
          return 0;
        }
        return (long)puVar11 - ((long)dst + ((ulong)((uVar5 & 7) == 0) - 1));
      }
    }
LAB_00109eb8:
    __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5df,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
  }
LAB_00109ed7:
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5de,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

static size_t FSE_compress_usingCTable_generic (void* dst, size_t dstSize,
                           const void* src, size_t srcSize,
                           const FSE_CTable* ct, const unsigned fast)
{
    const BYTE* const istart = (const BYTE*) src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip=iend;

    BIT_CStream_t bitC;
    FSE_CState_t CState1, CState2;

    /* init */
    if (srcSize <= 2) return 0;
    { size_t const initError = BIT_initCStream(&bitC, dst, dstSize);
      if (FSE_isError(initError)) return 0; /* not enough space available to write a bitstream */ }

#define FSE_FLUSHBITS(s)  (fast ? BIT_flushBitsFast(s) : BIT_flushBits(s))

    if (srcSize & 1) {
        FSE_initCState2(&CState1, ct, *--ip);
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    } else {
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_initCState2(&CState1, ct, *--ip);
    }

    /* join to mod 4 */
    srcSize -= 2;
    if ((sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) && (srcSize & 2)) {  /* test bit 2 */
        FSE_encodeSymbol(&bitC, &CState2, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    }

    /* 2 or 4 encoding per loop */
    while ( ip>istart ) {

        FSE_encodeSymbol(&bitC, &CState2, *--ip);

        if (sizeof(bitC.bitContainer)*8 < FSE_MAX_TABLELOG*2+7 )   /* this test must be static */
            FSE_FLUSHBITS(&bitC);

        FSE_encodeSymbol(&bitC, &CState1, *--ip);

        if (sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) {  /* this test must be static */
            FSE_encodeSymbol(&bitC, &CState2, *--ip);
            FSE_encodeSymbol(&bitC, &CState1, *--ip);
        }

        FSE_FLUSHBITS(&bitC);
    }

    FSE_flushCState(&bitC, &CState2);
    FSE_flushCState(&bitC, &CState1);
    return BIT_closeCStream(&bitC);
}